

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

bool __thiscall tchecker::clockbounds::df_solver_t::ensure_tight(df_solver_t *this)

{
  bool bVar1;
  status_t sVar2;
  byte local_12;
  bool local_11;
  bool consistent;
  df_solver_t *this_local;
  
  bVar1 = tchecker::dbm::is_empty_0(this->_L,(clock_id_t)this->_dim);
  local_12 = 0;
  if (!bVar1) {
    bVar1 = tchecker::dbm::is_empty_0(this->_U,(clock_id_t)this->_dim);
    local_12 = bVar1 ^ 0xff;
  }
  local_11 = (bool)(local_12 & 1);
  if ((this->_updated_L & 1U) != 0) {
    sVar2 = tchecker::dbm::tighten(this->_L,(clock_id_t)this->_dim);
    local_11 = (local_11 & sVar2 != EMPTY) != 0;
  }
  if ((this->_updated_U & 1U) != 0) {
    sVar2 = tchecker::dbm::tighten(this->_U,(clock_id_t)this->_dim);
    local_11 = (local_11 & sVar2 != EMPTY) != 0;
  }
  this->_updated_L = false;
  this->_updated_U = false;
  return local_11;
}

Assistant:

bool df_solver_t::ensure_tight()
{
  bool consistent = !tchecker::dbm::is_empty_0(_L, _dim) && !tchecker::dbm::is_empty_0(_U, _dim);

  if (_updated_L)
    consistent &= (tchecker::dbm::tighten(_L, _dim) != tchecker::dbm::EMPTY);
  if (_updated_U)
    consistent &= (tchecker::dbm::tighten(_U, _dim) != tchecker::dbm::EMPTY);

  _updated_L = false;
  _updated_U = false;

  return consistent;
}